

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elfio_utils.hpp
# Opt level: O3

void __thiscall
ELFIO::address_translator::set_address_translation
          (address_translator *this,
          vector<ELFIO::address_translation,_std::allocator<ELFIO::address_translation>_>
          *addr_trans)

{
  pointer paVar1;
  pointer paVar2;
  long lVar3;
  ulong uVar4;
  
  std::vector<ELFIO::address_translation,_std::allocator<ELFIO::address_translation>_>::operator=
            (&this->addr_translations,addr_trans);
  paVar1 = (this->addr_translations).
           super__Vector_base<ELFIO::address_translation,_std::allocator<ELFIO::address_translation>_>
           ._M_impl.super__Vector_impl_data._M_start;
  paVar2 = (this->addr_translations).
           super__Vector_base<ELFIO::address_translation,_std::allocator<ELFIO::address_translation>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (paVar1 != paVar2) {
    uVar4 = ((long)paVar2 - (long)paVar1 >> 4) * -0x5555555555555555;
    lVar3 = 0x3f;
    if (uVar4 != 0) {
      for (; uVar4 >> lVar3 == 0; lVar3 = lVar3 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<ELFIO::address_translation*,std::vector<ELFIO::address_translation,std::allocator<ELFIO::address_translation>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<ELFIO::address_translator::set_address_translation(std::vector<ELFIO::address_translation,std::allocator<ELFIO::address_translation>>&)::_lambda(ELFIO::address_translation_const&,ELFIO::address_translation_const&)_1_>>
              (paVar1,paVar2,((uint)lVar3 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<ELFIO::address_translation*,std::vector<ELFIO::address_translation,std::allocator<ELFIO::address_translation>>>,__gnu_cxx::__ops::_Iter_comp_iter<ELFIO::address_translator::set_address_translation(std::vector<ELFIO::address_translation,std::allocator<ELFIO::address_translation>>&)::_lambda(ELFIO::address_translation_const&,ELFIO::address_translation_const&)_1_>>
              (paVar1,paVar2);
    return;
  }
  return;
}

Assistant:

void set_address_translation( std::vector<address_translation>& addr_trans )
    {
        addr_translations = addr_trans;

        std::sort( addr_translations.begin(), addr_translations.end(),
                   []( const address_translation& a,
                       const address_translation& b ) -> bool {
                       return a.start < b.start;
                   } );
    }